

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ElementSelectExpression>
          (ConstraintExprVisitor *this,ElementSelectExpression *expr)

{
  BinaryOperator BVar1;
  FormalArgumentSymbol *pFVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  DiagCode code_03;
  DiagCode code_04;
  DiagCode code_05;
  DiagCode code_06;
  DiagCode code_07;
  bool bVar3;
  LanguageVersion LVar4;
  SubroutineKind SVar5;
  Expression *pEVar6;
  DistExpression *this_00;
  reference ppFVar7;
  SVInt *this_01;
  Expression *in_RSI;
  ASTContext *in_RDI;
  FormalArgumentSymbol *arg;
  iterator __end6;
  iterator __begin6;
  ArgList *__range6;
  SubroutineSymbol *sub;
  CallExpression *call;
  Expression *left;
  DistVarVisitor distVisitor;
  BinaryExpression *binExpr;
  bool oldSawRand;
  bool oldTop;
  bool childrenHaveRand;
  RandMode mode;
  Symbol *sym;
  SubroutineSymbol *in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe66;
  byte in_stack_fffffffffffffe67;
  byte bVar8;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  SourceLocation in_stack_fffffffffffffe80;
  SourceLocation in_stack_fffffffffffffe88;
  DiagSubsystem in_stack_fffffffffffffe94;
  bitmask<slang::ast::VariableFlags> in_stack_fffffffffffffe96;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 allowPacked;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0 [16];
  DistVarVisitor local_f0;
  SourceLocation local_e0;
  SourceLocation local_d8;
  undefined4 local_cc;
  BinaryExpression *local_c8;
  SourceLocation local_c0;
  SourceLocation local_b8;
  undefined4 local_ac;
  SVInt local_a8;
  SourceLocation local_98;
  SourceLocation local_90;
  undefined4 local_84;
  SVInt local_80;
  SourceLocation local_70;
  SourceLocation local_68;
  undefined4 local_5c;
  SourceLocation local_58;
  SourceLocation local_50;
  undefined4 local_42;
  undefined1 local_3d;
  byte local_3c;
  undefined1 local_3b;
  byte local_3a;
  byte local_39;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_28;
  RandMode local_24;
  Symbol *local_20;
  Expression *local_18;
  bool local_1;
  
  allowPacked = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  if (((*(bool *)&in_RDI->lookupIndex & 1U) != 0) ||
     (local_18 = in_RSI,
     bVar3 = Expression::bad((Expression *)
                             CONCAT17(in_stack_fffffffffffffe67,
                                      CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
                            ), bVar3)) {
    bVar3 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar3;
  }
  local_20 = Expression::getSymbolReference
                       ((Expression *)in_stack_fffffffffffffea8._M_current,(bool)allowPacked);
  if (local_20 != (Symbol *)0x0) {
    local_24 = ASTContext::getRandMode
                         (in_stack_fffffffffffffeb0._8_8_,in_stack_fffffffffffffeb0._0_8_);
    if (local_24 != None) {
      *(byte *)((long)&in_RDI->lookupIndex + 2) = 1;
    }
    if (((in_RDI->lookupIndex & 0x1000000) != 0) && (local_24 == RandC)) {
      local_28 = 0x390008;
      local_38 = (local_18->sourceRange).startLoc;
      local_30 = (local_18->sourceRange).endLoc;
      code.code = in_stack_fffffffffffffe96.m_bits;
      code.subsystem = in_stack_fffffffffffffe94;
      sourceRange.endLoc = in_stack_fffffffffffffe88;
      sourceRange.startLoc = in_stack_fffffffffffffe80;
      ASTContext::addDiag(in_RDI,code,sourceRange);
    }
  }
  local_39 = 0;
  if (((local_18->kind != ElementSelect) && (local_18->kind != MemberAccess)) &&
     (local_18->kind != Call)) {
    local_3b = 0;
    local_3a = std::exchange<bool,bool>
                         ((bool *)CONCAT17(in_stack_fffffffffffffe67,
                                           CONCAT16(in_stack_fffffffffffffe66,
                                                    in_stack_fffffffffffffe60)),
                          (bool *)in_stack_fffffffffffffe58);
    local_3d = 0;
    local_3c = std::exchange<bool,bool>
                         ((bool *)CONCAT17(in_stack_fffffffffffffe67,
                                           CONCAT16(in_stack_fffffffffffffe66,
                                                    in_stack_fffffffffffffe60)),
                          (bool *)in_stack_fffffffffffffe58);
    ElementSelectExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
              ((ElementSelectExpression *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
               (ConstraintExprVisitor *)in_stack_fffffffffffffe58);
    *(byte *)((long)&in_RDI->lookupIndex + 1) = local_3a & 1;
    local_39 = *(bool *)((long)&in_RDI->lookupIndex + 2) & 1;
    *(byte *)((long)&in_RDI->lookupIndex + 2) = local_3c & 1;
  }
  this_01 = (SVInt *)(ulong)(local_18->kind - IntegerLiteral);
  switch(this_01) {
  case (SVInt *)0x0:
    Expression::as<slang::ast::IntegerLiteral>(local_18);
    IntegerLiteral::getValue((IntegerLiteral *)in_stack_fffffffffffffe58);
    bVar8 = SVInt::hasUnknown(&local_80);
    SVInt::~SVInt(this_01);
    if ((bVar8 & 1) == 0) {
      return true;
    }
    local_84 = 0x500008;
    local_98 = (local_18->sourceRange).startLoc;
    local_90 = (local_18->sourceRange).endLoc;
    code_02.code = in_stack_fffffffffffffe96.m_bits;
    code_02.subsystem = in_stack_fffffffffffffe94;
    sourceRange_02.endLoc = in_stack_fffffffffffffe88;
    sourceRange_02.startLoc = in_stack_fffffffffffffe80;
    ASTContext::addDiag(in_RDI,code_02,sourceRange_02);
    bVar3 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar3;
  case (SVInt *)0x1:
  case (SVInt *)0x2:
    ASTContext::getCompilation((ASTContext *)0x888753);
    LVar4 = Compilation::languageVersion((Compilation *)0x88875b);
    if ((int)LVar4 < 1) {
      local_5c = 0x2f0008;
      local_70 = (local_18->sourceRange).startLoc;
      local_68 = (local_18->sourceRange).endLoc;
      code_01.code = in_stack_fffffffffffffe96.m_bits;
      code_01.subsystem = in_stack_fffffffffffffe94;
      sourceRange_01.endLoc = in_stack_fffffffffffffe88;
      sourceRange_01.startLoc = in_stack_fffffffffffffe80;
      ASTContext::addDiag(in_RDI,code_01,sourceRange_01);
      bVar3 = fail((ConstraintExprVisitor *)in_RDI);
      return bVar3;
    }
    break;
  case (SVInt *)0x3:
    Expression::as<slang::ast::UnbasedUnsizedIntegerLiteral>(local_18);
    UnbasedUnsizedIntegerLiteral::getValue
              ((UnbasedUnsizedIntegerLiteral *)in_stack_fffffffffffffe88);
    bVar8 = SVInt::hasUnknown(&local_a8);
    SVInt::~SVInt(this_01);
    if ((bVar8 & 1) == 0) {
      return true;
    }
    local_ac = 0x500008;
    local_c0 = (local_18->sourceRange).startLoc;
    local_b8 = (local_18->sourceRange).endLoc;
    code_03.code = in_stack_fffffffffffffe96.m_bits;
    code_03.subsystem = in_stack_fffffffffffffe94;
    sourceRange_03.endLoc = in_stack_fffffffffffffe88;
    sourceRange_03.startLoc = in_stack_fffffffffffffe80;
    ASTContext::addDiag(in_RDI,code_03,sourceRange_03);
    bVar3 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar3;
  default:
    break;
  case (SVInt *)0x7:
  case (SVInt *)0x8:
    if ((in_RDI->lookupIndex & 0x100) == 0) {
      return true;
    }
    break;
  case (SVInt *)0xa:
    local_c8 = Expression::as<slang::ast::BinaryExpression>(local_18);
    BVar1 = local_c8->op;
    if (1 < BVar1 - Equality) {
      if (BVar1 - CaseEquality < 2) {
LAB_008889b5:
        local_cc = 0x180008;
        local_e0 = (local_18->sourceRange).startLoc;
        local_d8 = (local_18->sourceRange).endLoc;
        code_04.code = in_stack_fffffffffffffe96.m_bits;
        code_04.subsystem = in_stack_fffffffffffffe94;
        sourceRange_04.endLoc = in_stack_fffffffffffffe88;
        sourceRange_04.startLoc = in_stack_fffffffffffffe80;
        ASTContext::addDiag(in_RDI,code_04,sourceRange_04);
        bVar3 = fail((ConstraintExprVisitor *)in_RDI);
        return bVar3;
      }
      if (3 < BVar1 - GreaterThanEqual) {
        if (BVar1 - WildcardEquality < 2) goto LAB_008889b5;
        if (3 < BVar1 - LogicalAnd) break;
      }
    }
    if ((local_39 & 1) != 0) {
      pEVar6 = BinaryExpression::left(local_c8);
      bVar3 = ValueExpressionBase::isKind(pEVar6->kind);
      if (bVar3) {
        BinaryExpression::left(local_c8);
        bVar3 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,
                          (Expression *)in_stack_fffffffffffffe80);
        if (!bVar3) {
          bVar3 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar3;
        }
      }
      pEVar6 = BinaryExpression::right(local_c8);
      bVar3 = ValueExpressionBase::isKind(pEVar6->kind);
      if (bVar3) {
        BinaryExpression::right(local_c8);
        bVar3 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,
                          (Expression *)in_stack_fffffffffffffe80);
        if (!bVar3) {
          bVar3 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar3;
        }
      }
    }
    break;
  case (SVInt *)0x10:
  case (SVInt *)0x20:
  case (SVInt *)0x21:
  case (SVInt *)0x23:
    local_42 = 0x180008;
    local_58 = (local_18->sourceRange).startLoc;
    local_50 = (local_18->sourceRange).endLoc;
    code_00.code = in_stack_fffffffffffffe96.m_bits;
    code_00.subsystem = in_stack_fffffffffffffe94;
    sourceRange_00.endLoc = in_stack_fffffffffffffe88;
    sourceRange_00.startLoc = in_stack_fffffffffffffe80;
    ASTContext::addDiag(in_RDI,code_00,sourceRange_00);
    bVar3 = fail((ConstraintExprVisitor *)in_RDI);
    return bVar3;
  case (SVInt *)0x14:
    Expression::as<slang::ast::CallExpression>(local_18);
    SVar5 = CallExpression::getSubroutineKind
                      ((CallExpression *)
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,
                                         CONCAT24(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68))));
    if (SVar5 == Task) {
      code_06.code = in_stack_fffffffffffffe96.m_bits;
      code_06.subsystem = in_stack_fffffffffffffe94;
      sourceRange_06.endLoc = in_stack_fffffffffffffe88;
      sourceRange_06.startLoc = in_stack_fffffffffffffe80;
      ASTContext::addDiag(in_RDI,code_06,sourceRange_06);
      bVar3 = fail((ConstraintExprVisitor *)in_RDI);
      return bVar3;
    }
    bVar3 = CallExpression::isSystemCall((CallExpression *)0x888c47);
    if (!bVar3) {
      std::get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                  *)0x888c60);
      SubroutineSymbol::getArguments(in_stack_fffffffffffffe58);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffe58);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffe6f,
                          CONCAT16(in_stack_fffffffffffffe6e,
                                   CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))));
      while (bVar3 = __gnu_cxx::
                     operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)CONCAT17(in_stack_fffffffffffffe67,
                                            CONCAT16(in_stack_fffffffffffffe66,
                                                     in_stack_fffffffffffffe60)),
                                (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe58), ((bVar3 ^ 0xffU) & 1) != 0) {
        ppFVar7 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  ::operator*((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)&stack0xfffffffffffffea8);
        pFVar2 = *ppFVar7;
        in_stack_fffffffffffffe67 = 1;
        if (((pFVar2->direction != Out) &&
            (bVar8 = 1, in_stack_fffffffffffffe67 = bVar8, pFVar2->direction != InOut)) &&
           (in_stack_fffffffffffffe66 = 0, in_stack_fffffffffffffe67 = in_stack_fffffffffffffe66,
           pFVar2->direction == Ref)) {
          in_stack_fffffffffffffe58 = (SubroutineSymbol *)&(pFVar2->super_VariableSymbol).flags;
          bitmask<slang::ast::VariableFlags>::bitmask
                    ((bitmask<slang::ast::VariableFlags> *)&stack0xfffffffffffffe96,Const);
          bVar3 = bitmask<slang::ast::VariableFlags>::has
                            ((bitmask<slang::ast::VariableFlags> *)
                             CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe66,
                                                     in_stack_fffffffffffffe60)),
                             (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffe58);
          in_stack_fffffffffffffe66 = bVar3 ^ 0xff;
          in_stack_fffffffffffffe67 = in_stack_fffffffffffffe66;
        }
        if ((in_stack_fffffffffffffe67 & 1) != 0) {
          code_07.code = in_stack_fffffffffffffe96.m_bits;
          code_07.subsystem = 0x32;
          ASTContext::addDiag(in_RDI,code_07,local_18->sourceRange);
          bVar3 = fail((ConstraintExprVisitor *)in_RDI);
          return bVar3;
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      *)&stack0xfffffffffffffea8);
      }
    }
    break;
  case (SVInt *)0x1e:
    return true;
  case (SVInt *)0x1f:
    DistVarVisitor::DistVarVisitor(&local_f0,(ASTContext *)(in_RDI->scope).ptr);
    this_00 = Expression::as<slang::ast::DistExpression>(local_18);
    DistExpression::left(this_00);
    Expression::visit<slang::ast::DistVarVisitor&>
              ((Expression *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
               (DistVarVisitor *)in_stack_fffffffffffffe58);
    if ((local_f0.anyRandVars & 1U) == 0) {
      code_05.code = in_stack_fffffffffffffe96.m_bits;
      code_05.subsystem = in_stack_fffffffffffffe94;
      sourceRange_05.endLoc = in_stack_fffffffffffffe88;
      sourceRange_05.startLoc = in_stack_fffffffffffffe80;
      ASTContext::addDiag(in_RDI,code_05,sourceRange_05);
    }
    return true;
  }
  bVar3 = checkType((ConstraintExprVisitor *)in_stack_fffffffffffffe88,
                    (Expression *)in_stack_fffffffffffffe80);
  if (bVar3) {
    local_1 = true;
  }
  else {
    local_1 = fail((ConstraintExprVisitor *)in_RDI);
  }
  return local_1;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }